

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O0

void __thiscall EnvmapImage::resize(EnvmapImage *this,Envmap type,Box2i *dataWindow)

{
  int in_ESI;
  Box<Imath_3_2::Vec2<int>_> *in_RDI;
  long in_stack_00000028;
  Array2D<Imf_3_4::Rgba> *in_stack_00000030;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeEraseUnsafe(in_stack_00000030,in_stack_00000028,(long)this)
  ;
  (in_RDI->min).x = in_ESI;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  clear((EnvmapImage *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void
EnvmapImage::resize (Envmap type, const Box2i& dataWindow)
{
    _pixels.resizeEraseUnsafe (
        dataWindow.max.y - dataWindow.min.y + 1,
        dataWindow.max.x - dataWindow.min.x + 1);
    _type       = type;
    _dataWindow = dataWindow;

    clear ();
}